

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O0

void Hacl_Bignum256_mul(uint64_t *a,uint64_t *b,uint64_t *res)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t r_3;
  uint64_t *res_i_3;
  uint64_t a_i2_3;
  uint64_t *res_i2_3;
  uint64_t a_i1_3;
  uint64_t *res_i1_3;
  uint64_t a_i0_3;
  uint64_t *res_i0_3;
  uint64_t a_i_3;
  uint64_t c_3;
  uint64_t *res_j_3;
  uint64_t bj_3;
  uint64_t r_2;
  uint64_t *res_i_2;
  uint64_t a_i2_2;
  uint64_t *res_i2_2;
  uint64_t a_i1_2;
  uint64_t *res_i1_2;
  uint64_t a_i0_2;
  uint64_t *res_i0_2;
  uint64_t a_i_2;
  uint64_t c_2;
  uint64_t *res_j_2;
  uint64_t bj_2;
  uint64_t r_1;
  uint64_t *res_i_1;
  uint64_t a_i2_1;
  uint64_t *res_i2_1;
  uint64_t a_i1_1;
  uint64_t *res_i1_1;
  uint64_t a_i0_1;
  uint64_t *res_i0_1;
  uint64_t a_i_1;
  uint64_t c_1;
  uint64_t *res_j_1;
  uint64_t bj_1;
  uint64_t r;
  uint64_t *res_i;
  uint64_t a_i2;
  uint64_t *res_i2;
  uint64_t a_i1;
  uint64_t *res_i1;
  uint64_t a_i0;
  uint64_t *res_i0;
  uint64_t a_i;
  uint64_t c;
  uint64_t *res_j;
  uint64_t bj;
  uint32_t i0;
  uint64_t *res_local;
  uint64_t *b_local;
  uint64_t *a_local;
  
  memset(res,0,0x40);
  uVar2 = *b;
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(*a,uVar2,0,res);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(a[1],uVar2,uVar1,res + 1);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(a[2],uVar2,uVar1,res + 2);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u64(a[3],uVar2,uVar1,res + 3);
  res[4] = uVar2;
  uVar2 = b[1];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(*a,uVar2,0,res + 1);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(a[1],uVar2,uVar1,res + 2);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(a[2],uVar2,uVar1,res + 3);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u64(a[3],uVar2,uVar1,res + 4);
  res[5] = uVar2;
  uVar2 = b[2];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(*a,uVar2,0,res + 2);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(a[1],uVar2,uVar1,res + 3);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(a[2],uVar2,uVar1,res + 4);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u64(a[3],uVar2,uVar1,res + 5);
  res[6] = uVar2;
  uVar2 = b[3];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(*a,uVar2,0,res + 3);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(a[1],uVar2,uVar1,res + 4);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u64(a[2],uVar2,uVar1,res + 5);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u64(a[3],uVar2,uVar1,res + 6);
  res[7] = uVar2;
  return;
}

Assistant:

void Hacl_Bignum256_mul(uint64_t *a, uint64_t *b, uint64_t *res)
{
  memset(res, 0U, 8U * sizeof (uint64_t));
  KRML_MAYBE_FOR4(i0,
    0U,
    4U,
    1U,
    uint64_t bj = b[i0];
    uint64_t *res_j = res + i0;
    uint64_t c = 0ULL;
    {
      uint64_t a_i = a[4U * 0U];
      uint64_t *res_i0 = res_j + 4U * 0U;
      c = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, bj, c, res_i0);
      uint64_t a_i0 = a[4U * 0U + 1U];
      uint64_t *res_i1 = res_j + 4U * 0U + 1U;
      c = Hacl_Bignum_Base_mul_wide_add2_u64(a_i0, bj, c, res_i1);
      uint64_t a_i1 = a[4U * 0U + 2U];
      uint64_t *res_i2 = res_j + 4U * 0U + 2U;
      c = Hacl_Bignum_Base_mul_wide_add2_u64(a_i1, bj, c, res_i2);
      uint64_t a_i2 = a[4U * 0U + 3U];
      uint64_t *res_i = res_j + 4U * 0U + 3U;
      c = Hacl_Bignum_Base_mul_wide_add2_u64(a_i2, bj, c, res_i);
    }
    uint64_t r = c;
    res[4U + i0] = r;);
}